

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

uint __thiscall llvm::SourceMgr::SrcBuffer::getLineNumber<unsigned_char>(SrcBuffer *this,char *Ptr)

{
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  PVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uchar local_31;
  
  PVar7.Value = (this->OffsetCache).
                super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_0,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
                .
                super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_1,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
                .
                super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_2,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
                .
                super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_3,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
                .
                super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_4>
                .Val.Value;
  if ((ulong)PVar7.Value < 8) {
    PVar7.Value = (intptr_t)operator_new(0x18);
    *(undefined8 *)PVar7.Value = 0;
    *(pointer *)(PVar7.Value + 8) = (pointer)0x0;
    *(pointer *)(PVar7.Value + 0x10) = (pointer)0x0;
    if ((PVar7.Value & 7U) != 0) {
      __assert_fail("(PtrWord & ~PointerBitMask) == 0 && \"Pointer is not sufficiently aligned\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/PointerIntPair.h"
                    ,0xb3,
                    "static intptr_t llvm::PointerIntPairInfo<void *, 2, llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>>::updatePointer(intptr_t, PointerT) [PointerT = void *, IntBits = 2, PtrTraits = llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>]"
                   );
    }
    (this->OffsetCache).
    super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_0,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    .
    super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_1,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    .
    super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_2,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    .
    super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_3,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    .
    super_PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_4>
    .Val.Value = PVar7.Value;
    _Var1._M_head_impl =
         (this->Buffer)._M_t.
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    pcVar2 = (_Var1._M_head_impl)->BufferStart;
    pcVar3 = (_Var1._M_head_impl)->BufferEnd;
    uVar11 = (long)pcVar3 - (long)pcVar2;
    if (0xff < uVar11) {
      __assert_fail("Sz <= std::numeric_limits<T>::max()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                    ,0x51,
                    "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
                   );
    }
    if (pcVar3 != pcVar2) {
      lVar10 = 0;
      do {
        if (pcVar2[lVar10] == '\n') {
          local_31 = (uchar)lVar10;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)PVar7.Value,&local_31)
          ;
        }
        lVar10 = lVar10 + 1;
      } while (uVar11 + (uVar11 == 0) != lVar10);
    }
  }
  else {
    if ((PVar7.Value & 6U) != 0) {
      __assert_fail("is<T>() && \"Invalid accessor called\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/PointerUnion.h"
                    ,0xc3,
                    "T llvm::PointerUnion<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>::get() const [PTs = <std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>, T = std::vector<unsigned char> *]"
                   );
    }
    PVar7.Value = PVar7.Value & 0xfffffffffffffff8;
  }
  _Var1._M_head_impl =
       (this->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  pcVar2 = (_Var1._M_head_impl)->BufferStart;
  if ((pcVar2 <= Ptr) && (Ptr <= (_Var1._M_head_impl)->BufferEnd)) {
    uVar11 = (long)Ptr - (long)pcVar2;
    if (uVar11 < 0x100) {
      pbVar4 = *(byte **)&((vector<unsigned_char,_std::allocator<unsigned_char>_> *)PVar7.Value)->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      pbVar6 = pbVar4;
      uVar9 = (long)*(pointer *)
                     ((long)&((vector<unsigned_char,_std::allocator<unsigned_char>_> *)PVar7.Value)
                             ->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8
                     ) - (long)pbVar4;
      while (pbVar5 = pbVar6, 0 < (long)uVar9) {
        uVar8 = uVar9 >> 1;
        uVar9 = ~uVar8 + uVar9;
        pbVar6 = pbVar5 + uVar8 + 1;
        if ((byte)uVar11 <= pbVar5[uVar8]) {
          pbVar6 = pbVar5;
          uVar9 = uVar8;
        }
      }
      return ((int)pbVar5 - (int)pbVar4) + 1;
    }
    __assert_fail("PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                  ,0x5f,
                  "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
                 );
  }
  __assert_fail("Ptr >= BufStart && Ptr <= Buffer->getBufferEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                ,0x5d,
                "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
               );
}

Assistant:

unsigned SourceMgr::SrcBuffer::getLineNumber(const char *Ptr) const {

  // Ensure OffsetCache is allocated and populated with offsets of all the
  // '\n' bytes.
  std::vector<T> *Offsets = nullptr;
  if (OffsetCache.isNull()) {
    Offsets = new std::vector<T>();
    OffsetCache = Offsets;
    size_t Sz = Buffer->getBufferSize();
    assert(Sz <= std::numeric_limits<T>::max());
    StringRef S = Buffer->getBuffer();
    for (size_t N = 0; N < Sz; ++N) {
      if (S[N] == '\n') {
        Offsets->push_back(static_cast<T>(N));
      }
    }
  } else {
    Offsets = OffsetCache.get<std::vector<T> *>();
  }

  const char *BufStart = Buffer->getBufferStart();
  assert(Ptr >= BufStart && Ptr <= Buffer->getBufferEnd());
  ptrdiff_t PtrDiff = Ptr - BufStart;
  assert(PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max());
  T PtrOffset = static_cast<T>(PtrDiff);

  // llvm::lower_bound gives the number of EOL before PtrOffset. Add 1 to get
  // the line number.
  return llvm::lower_bound(*Offsets, PtrOffset) - Offsets->begin() + 1;
}